

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime __thiscall QDateTime::addMSecs(QDateTime *this,qint64 msecs)

{
  undefined8 uVar1;
  ulong uVar2;
  QDateTimePrivate *pQVar3;
  long in_RDX;
  qint64 qVar4;
  QDateTimePrivate *pQVar5;
  
  uVar2 = *(ulong *)msecs;
  if ((uVar2 & 1) == 0) {
    uVar2 = (ulong)*(uint *)(uVar2 + 4);
  }
  if ((uVar2 & 8) == 0) {
    QDateTime(this);
    return (QDateTime)this;
  }
  (this->d).d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime(this,(QDateTime *)msecs);
  uVar2 = *(ulong *)msecs;
  if ((uVar2 & 1) == 0) {
    if (1 < (*(uint *)(uVar2 + 4) >> 4 & 3) - 1) goto LAB_0034a709;
    qVar4 = in_RDX + *(long *)(uVar2 + 8);
    if (!SCARRY8(in_RDX,*(long *)(uVar2 + 8))) goto LAB_0034a774;
LAB_0034a6e9:
    pQVar5 = (this->d).d;
    if (((ulong)pQVar5 & 1) != 0) goto LAB_0034a733;
    if ((__int_type_conflict)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 1) goto LAB_0034a899;
    pQVar3 = (QDateTimePrivate *)operator_new(0x20);
  }
  else {
    if (((uint)(uVar2 >> 4) & 3) - 1 < 2) {
      qVar4 = ((long)uVar2 >> 8) + in_RDX;
      if (SCARRY8((long)uVar2 >> 8,in_RDX)) goto LAB_0034a6e9;
      if (qVar4 + 0x80000000000000U >> 0x38 == 0) {
        (this->d).d = (QDateTimePrivate *)(qVar4 * 0x100 | (ulong)*(byte *)&this->d);
        return (QDateTime)this;
      }
LAB_0034a774:
      pQVar5 = (this->d).d;
      if (((ulong)pQVar5 & 1) == 0) {
        pQVar3 = pQVar5;
        if ((__int_type_conflict)
            (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> == 1) goto LAB_0034a831;
        pQVar3 = (QDateTimePrivate *)operator_new(0x20);
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        uVar1 = *(undefined8 *)((long)&pQVar5->m_msecs + 4);
        *(undefined8 *)&pQVar3->m_status = *(undefined8 *)&pQVar5->m_status;
        *(undefined8 *)((long)&pQVar3->m_msecs + 4) = uVar1;
        QTimeZone::QTimeZone(&pQVar3->m_timeZone,&pQVar5->m_timeZone);
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 1;
        pQVar5 = (this->d).d;
        LOCK();
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)
              (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type_conflict)
            (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> == 0) {
          pQVar5 = (this->d).d;
          if (pQVar5 != (QDateTimePrivate *)0x0) {
            QTimeZone::~QTimeZone(&pQVar5->m_timeZone);
          }
          operator_delete(pQVar5,0x20);
        }
      }
      else {
        pQVar3 = (QDateTimePrivate *)operator_new(0x20);
        pQVar3->super_QSharedData = (QAtomicInt)0x0;
        pQVar3->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
        pQVar3->m_msecs = 0;
        pQVar3->m_offsetFromUtc = 0;
        QTimeZone::QTimeZone(&pQVar3->m_timeZone);
        pQVar5 = (this->d).d;
        (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (uint)pQVar5 & 0xfe;
        pQVar3->m_msecs = (long)pQVar5 >> 8;
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 1;
      }
      (this->d).d = pQVar3;
LAB_0034a831:
      pQVar3->m_msecs = qVar4;
      return (QDateTime)(Data)this;
    }
LAB_0034a709:
    qVar4 = toMSecsSinceEpoch((QDateTime *)msecs);
    if (!SCARRY8(qVar4,in_RDX)) {
      setMSecsSinceEpoch(this,qVar4 + in_RDX);
      return (QDateTime)this;
    }
    pQVar5 = (this->d).d;
    if (((ulong)pQVar5 & 1) != 0) {
LAB_0034a733:
      (this->d).d = (QDateTimePrivate *)((ulong)pQVar5 & 0xfffffffffffffff1);
      return (QDateTime)this;
    }
    if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 1) goto LAB_0034a899;
    pQVar3 = (QDateTimePrivate *)operator_new(0x20);
  }
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  uVar1 = *(undefined8 *)((long)&pQVar5->m_msecs + 4);
  *(undefined8 *)&pQVar3->m_status = *(undefined8 *)&pQVar5->m_status;
  *(undefined8 *)((long)&pQVar3->m_msecs + 4) = uVar1;
  QTimeZone::QTimeZone(&pQVar3->m_timeZone,&pQVar5->m_timeZone);
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar5 = (this->d).d;
  LOCK();
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type_conflict)
      (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar5 = (this->d).d;
    if (pQVar5 != (QDateTimePrivate *)0x0) {
      QTimeZone::~QTimeZone(&pQVar5->m_timeZone);
    }
    operator_delete(pQVar5,0x20);
  }
  (this->d).d = pQVar3;
  pQVar5 = pQVar3;
LAB_0034a899:
  *(byte *)&(pQVar5->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
       (byte)(pQVar5->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xf1;
  return (QDateTime)this;
}

Assistant:

QDateTime QDateTime::addMSecs(qint64 msecs) const
{
    if (!isValid())
        return QDateTime();

    QDateTime dt(*this);
    switch (getSpec(d)) {
    case Qt::LocalTime:
    case Qt::TimeZone:
        // Convert to real UTC first in case this crosses a DST transition:
        if (!qAddOverflow(toMSecsSinceEpoch(), msecs, &msecs))
            dt.setMSecsSinceEpoch(msecs);
        else
            dt.d.invalidate();
        break;
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        // No need to convert, just add on
        if (qAddOverflow(getMSecs(d), msecs, &msecs)) {
            dt.d.invalidate();
        } else if (d.isShort() && msecsCanBeSmall(msecs)) {
            dt.d.data.msecs = qintptr(msecs);
        } else {
            dt.d.detach();
            dt.d->m_msecs = msecs;
        }
        break;
    }
    return dt;
}